

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

void __thiscall ncnn::ParamDict::~ParamDict(ParamDict *this)

{
  ParamDictPrivate *pPVar1;
  long *plVar2;
  int *piVar3;
  void *__ptr;
  long *plVar4;
  long lVar5;
  
  this->_vptr_ParamDict = (_func_int **)&PTR__ParamDict_005fe488;
  pPVar1 = this->d;
  if (pPVar1 != (ParamDictPrivate *)0x0) {
    lVar5 = 0;
    do {
      plVar4 = (long *)(pPVar1->params[0x1f].s.field_2._M_local_buf + lVar5);
      plVar2 = *(long **)((long)&pPVar1->params[0x1f].s._M_dataplus._M_p + lVar5);
      if (plVar4 != plVar2) {
        operator_delete(plVar2,*plVar4 + 1);
      }
      piVar3 = *(int **)((long)&pPVar1->params[0x1f].v.refcount + lVar5);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          __ptr = *(void **)((long)&pPVar1->params[0x1f].v.data + lVar5);
          plVar4 = *(long **)((long)&pPVar1->params[0x1f].v.allocator + lVar5);
          if (plVar4 == (long *)0x0) {
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
          }
          else {
            (**(code **)(*plVar4 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&pPVar1->params[0x1f].v.cstep + lVar5) = 0;
      *(undefined8 *)((long)&pPVar1->params[0x1f].v.refcount + lVar5 + 4) = 0;
      *(undefined8 *)((long)&pPVar1->params[0x1f].v.elemsize + lVar5 + 4) = 0;
      *(undefined8 *)((long)&pPVar1->params[0x1f].v.data + lVar5) = 0;
      *(undefined8 *)((long)&pPVar1->params[0x1f].v.refcount + lVar5) = 0;
      *(undefined8 *)((long)&pPVar1->params[0x1f].v.dims + lVar5) = 0;
      *(undefined8 *)((long)&pPVar1->params[0x1f].v.h + lVar5) = 0;
      *(undefined4 *)((long)&pPVar1->params[0x1f].v.c + lVar5) = 0;
      lVar5 = lVar5 + -0x70;
    } while (lVar5 != -0xe00);
  }
  operator_delete(pPVar1,0xe00);
  return;
}

Assistant:

ParamDict::~ParamDict()
{
    delete d;
}